

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receptor.cpp
# Opt level: O0

void __thiscall indk::Neuron::Receptor::Receptor(Receptor *this)

{
  Position *pPVar1;
  Receptor *this_local;
  
  std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::vector(&this->CP);
  std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::vector(&this->CPf);
  std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::vector(&this->ReferencePos);
  pPVar1 = (Position *)operator_new(0x10);
  Position::Position(pPVar1);
  this->DefaultPos = pPVar1;
  pPVar1 = (Position *)operator_new(0x10);
  Position::Position(pPVar1);
  this->PhantomPos = pPVar1;
  this->k3 = 0.0;
  this->Rs = 0.01;
  this->Locked = false;
  this->L = 0.0;
  this->Lf = 0.0;
  this->Fi = 0.0;
  this->dFi = 0.0;
  doCreateNewScope(this);
  return;
}

Assistant:

indk::Neuron::Receptor::Receptor() {
	DefaultPos = new indk::Position();
	PhantomPos = new indk::Position();
    k3 = 0;
    Rs = 0.01;
    Locked = false;
    L = 0;
    Lf = 0;
    Fi = 0;
    dFi = 0;
    doCreateNewScope();
}